

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::OctoquadMatcher::Match
          (OctoquadMatcher *this,Char *input,CharCount inputLength,CharCount *offset,
          RegexStats *stats)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint local_4c;
  CharCount next;
  uint32 rp;
  uint32 lp;
  int i;
  uint32 v;
  RegexStats *stats_local;
  CharCount *offset_local;
  CharCount inputLength_local;
  Char *input_local;
  OctoquadMatcher *this_local;
  
  if (inputLength < 8) {
    this_local._7_1_ = false;
  }
  else if (inputLength - 8 < *offset) {
    this_local._7_1_ = false;
  }
  else {
    lp = 0;
    for (rp = 0; (int)rp < 8; rp = rp + 1) {
      if (stats != (RegexStats *)0x0) {
        stats->numCompares = stats->numCompares + 1;
      }
      lp = lp << 4;
      uVar4 = Chars<char16_t>::CTU(input[*offset + rp]);
      if (uVar4 < 0x80) {
        uVar4 = Chars<char16_t>::CTU(input[*offset + rp]);
        lp = this->charToBits[uVar4] | lp;
      }
    }
    uVar1 = this->patterns[0];
    uVar2 = this->patterns[1];
    local_4c = *offset + 8;
    while ((bVar3 = oneBitSetInEveryQuad(lp & uVar1), !bVar3 &&
           (bVar3 = oneBitSetInEveryQuad(lp & uVar2), !bVar3))) {
      if (inputLength <= local_4c) {
        return false;
      }
      if (stats != (RegexStats *)0x0) {
        stats->numCompares = stats->numCompares + 1;
      }
      lp = lp << 4;
      uVar4 = Chars<char16_t>::CTU(input[local_4c]);
      if (uVar4 < 0x80) {
        uVar4 = Chars<char16_t>::CTU(input[local_4c]);
        lp = this->charToBits[uVar4] | lp;
      }
      local_4c = local_4c + 1;
    }
    *offset = local_4c - 8;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OctoquadMatcher::Match
        ( const Char* const input
        , const CharCount inputLength
        , CharCount& offset
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        )
    {
        Assert(TrigramInfo::PatternLength == 8);
        Assert(OctoquadIdentifier::NumPatterns == 2);

        if (inputLength < TrigramInfo::PatternLength)
            return false;
        if (offset > inputLength - TrigramInfo::PatternLength)
            return false;

        uint32 v = 0;
        for (int i = 0; i < TrigramInfo::PatternLength; i++)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif
            v <<= 4;
            if (CTU(input[offset + i]) < TrigramAlphabet::AsciiTableSize)
                v |= charToBits[CTU(input[offset + i])];
        }

        const uint32 lp = patterns[0];
        const uint32 rp = patterns[1];
        CharCount next = offset + TrigramInfo::PatternLength;

        while (true)
        {
            if (oneBitSetInEveryQuad(v & lp) || oneBitSetInEveryQuad(v & rp))
            {
                offset = next - TrigramInfo::PatternLength;
                return true;
            }
            if (next >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif
            v <<= 4;
            if (CTU(input[next]) < TrigramAlphabet::AsciiTableSize)
                v |= charToBits[CTU(input[next])];
            next++;
        }
    }